

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StorageUniform16(Instruction *instruction)

{
  anon_class_24_3_71d92ec5 condition;
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  CapabilitySet *this;
  Capability local_5c;
  DecorationManager *local_58;
  byte local_50;
  undefined7 uStack_4f;
  bool *local_48;
  bool local_39;
  DecorationManager *pDStack_38;
  bool found16bitType;
  DecorationManager *decoration_mgr;
  bool hasBufferBlockCapability;
  FeatureManager *pFStack_28;
  FeatureManager *feature_manager;
  Instruction *pIStack_18;
  StorageClass storage_class;
  Instruction *instruction_local;
  
  pIStack_18 = instruction;
  OVar2 = Instruction::opcode(instruction);
  if (OVar2 == OpTypePointer) {
    feature_manager._4_4_ = Instruction::GetSingleWordInOperand(pIStack_18,0);
    if (feature_manager._4_4_ == 2) {
      pIVar3 = Instruction::context(pIStack_18);
      pFStack_28 = IRContext::get_feature_mgr(pIVar3);
      bVar1 = anon_unknown_0::Has16BitCapability(pFStack_28);
      if (bVar1) {
        this = FeatureManager::GetCapabilities(pFStack_28);
        decoration_mgr._6_1_ =
             EnumSet<spv::Capability>::contains(this,CapabilityStorageBuffer16BitAccess);
        pIVar3 = Instruction::context(pIStack_18);
        local_58 = IRContext::get_decoration_mgr(pIVar3);
        local_39 = false;
        local_50 = decoration_mgr._6_1_ & 1;
        local_48 = &local_39;
        condition._8_8_ = CONCAT71(uStack_4f,decoration_mgr._6_1_) & 0xffffffffffffff01;
        condition.decoration_mgr = local_58;
        condition.found16bitType = local_48;
        pDStack_38 = local_58;
        (anonymous_namespace)::
        DFSWhile<spvtools::opt::Handler_OpTypePointer_StorageUniform16(spvtools::opt::Instruction_const*)::__0>
                  (pIStack_18,condition);
        if ((local_39 & 1U) == 0) {
          std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
        }
        else {
          local_5c = CapabilityStorageUniform16;
          std::optional<spv::Capability>::optional<spv::Capability,_true>
                    ((optional<spv::Capability> *)&instruction_local,&local_5c);
        }
      }
      else {
        std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
      }
    }
    else {
      std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
    }
    return (_Optional_base<spv::Capability,_true,_true>)
           (_Optional_base<spv::Capability,_true,_true>)instruction_local;
  }
  __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                ,0xf7,
                "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StorageUniform16(const Instruction *)"
               );
}

Assistant:

static std::optional<spv::Capability> Handler_OpTypePointer_StorageUniform16(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a Uniform storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return std::nullopt;
  }

  const auto* feature_manager = instruction->context()->get_feature_mgr();
  if (!Has16BitCapability(feature_manager)) {
    return std::nullopt;
  }

  const bool hasBufferBlockCapability =
      feature_manager->GetCapabilities().contains(
          spv::Capability::StorageUniformBufferBlock16);
  const auto* decoration_mgr = instruction->context()->get_decoration_mgr();
  bool found16bitType = false;

  DFSWhile(instruction, [decoration_mgr, hasBufferBlockCapability,
                         &found16bitType](const Instruction* item) {
    if (found16bitType) {
      return false;
    }

    if (hasBufferBlockCapability &&
        decoration_mgr->HasDecoration(item->result_id(),
                                      spv::Decoration::BufferBlock)) {
      return false;
    }

    if (is16bitType(item)) {
      found16bitType = true;
      return false;
    }

    return true;
  });

  return found16bitType ? std::optional(spv::Capability::StorageUniform16)
                        : std::nullopt;
}